

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

uint prvTidyReadChar(StreamIn *in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  TidyDocImpl *doc;
  Lexer *pLVar3;
  unsigned_short uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  Bool BVar8;
  uint uVar9;
  uint *puVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  uint code;
  
  if (in->pushed == no) {
    uVar6 = *(int *)&in->curlastpos + 1U & 0x3f;
    uVar4 = (unsigned_short)uVar6;
    in->curlastpos = uVar4;
    if (uVar4 == in->firstlastpos) {
      in->firstlastpos = in->firstlastpos + 1 & 0x3f;
    }
    iVar13 = in->curcol;
    in->lastcols[uVar6] = iVar13;
    if (in->tabs < 1) {
      do {
        do {
          uVar7 = ReadCharFromStream(in);
          if ((int)uVar7 < 10) {
            if (uVar7 == 0xffffffff) {
              return 0xffffffff;
            }
            if (uVar7 == 9) {
              uVar7 = 9;
              if (*(int *)((in->doc->config).value + 0x2b) == 0) {
                uVar6 = *(uint *)((in->doc->config).value + 0x53);
                if (uVar6 == 0) {
                  iVar13 = 0;
                }
                else {
                  iVar13 = ~((in->curcol - 1U) % uVar6) + uVar6;
                }
                in->tabs = iVar13;
                uVar7 = 0x20;
              }
              goto LAB_00151ea7;
            }
          }
          else {
            if (uVar7 == 0x1b) {
              return 0x1b;
            }
            if (uVar7 == 0xd) {
              uVar7 = ReadCharFromStream(in);
              if (uVar7 != 10) {
                prvTidyUngetChar(uVar7,in);
              }
LAB_00151e4f:
              in->curcol = 1;
              in->curline = in->curline + 1;
              return 10;
            }
            if (uVar7 == 10) goto LAB_00151e4f;
          }
        } while (uVar7 < 0x20);
        uVar6 = in->encoding;
        if (uVar6 - 9 < 3) {
          BVar8 = prvTidyIsValidUTF16FromUCS4(uVar7);
          if (BVar8 == no) {
            prvTidyReportEncodingError(in->doc,0x24c,uVar7,yes);
            uVar7 = 0;
          }
          else {
            BVar8 = prvTidyIsLowSurrogate(uVar7);
            if (BVar8 != no) {
              uVar9 = ReadCharFromStream(in);
              if (uVar9 != 0xffffffff) {
                BVar8 = prvTidyIsHighSurrogate(uVar9);
                if (BVar8 == no) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = prvTidyCombineSurrogatePair(uVar9,uVar7);
                  BVar8 = prvTidyIsValidCombinedChar(uVar7);
                  if (BVar8 == no) {
                    uVar7 = 0;
                  }
                }
                if (uVar7 == 0) {
                  prvTidyReportEncodingError(in->doc,0x24c,0,yes);
                }
              }
              if (uVar9 == 0xffffffff) {
                return 0xffffffff;
              }
            }
          }
        }
        else if ((uVar6 < 0xe) && ((0x3031U >> (uVar6 & 0x1f) & 1) != 0)) {
LAB_00151ea7:
          in->curcol = in->curcol + 1;
          return uVar7;
        }
        uVar6 = in->encoding;
        if (uVar6 == 2) {
          if (uVar7 - 0xa4 < 0x1b) {
            uVar12 = uVar7 & 0xff;
            if (uVar12 < 0xb4) {
              if (uVar12 == 0xa4) {
                uVar7 = 0x20ac;
              }
              else if (uVar12 == 0xa6) {
                uVar7 = 0x160;
              }
              else if (uVar12 == 0xa8) {
                uVar7 = 0x161;
              }
            }
            else {
              switch(uVar12) {
              case 0xb4:
                uVar7 = 0x17d;
                break;
              case 0xb8:
                uVar7 = 0x17e;
                break;
              case 0xbc:
                uVar7 = 0x152;
                break;
              case 0xbd:
                uVar7 = 0x153;
                break;
              case 0xbe:
                uVar7 = 0x178;
              }
            }
          }
        }
        else if (uVar6 == 8) {
          if ((uVar7 & 0xffffff80) == 0x80) {
            uVar7 = IBM2Unicode[uVar7 - 0x80];
          }
        }
        else if ((uVar6 == 6) && ((uVar7 & 0xffffff80) == 0x80)) {
          uVar7 = Mac2Unicode[uVar7 - 0x80];
        }
        uVar9 = uVar7;
        if ((uVar7 & 0xffffffe0) == 0x80) {
          doc = in->doc;
          pLVar3 = doc->lexer;
          if (pLVar3 != (Lexer *)0x0) {
            pLVar3->lines = in->curline;
            pLVar3->columns = in->curcol;
          }
          puVar10 = Win2Unicode;
          if (uVar6 == 6) {
            puVar10 = Mac2Unicode;
          }
          uVar9 = puVar10[uVar7 - 0x80];
          if (((uVar6 & 0xfffffffe) == 6) && (uVar9 == 0)) {
            code = 0x28f;
            BVar8 = yes;
          }
          else {
            if ((uVar6 & 0xfffffffe) == 6) goto LAB_00151e22;
            BVar8 = (Bool)(uVar9 == 0);
            code = 0x24a;
          }
          prvTidyReportEncodingError(doc,code,uVar7,BVar8);
        }
LAB_00151e22:
      } while (uVar9 == 0);
      in->curcol = in->curcol + 1;
    }
    else {
      in->curcol = iVar13 + 1;
      in->tabs = in->tabs + -1;
      uVar9 = 0x20;
    }
  }
  else {
    if (in->bufpos == 0) {
      __assert_fail("in->bufpos > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/streamio.c"
                    ,0x1a5,"uint PopChar(StreamIn *)");
    }
    uVar6 = in->bufpos - 1;
    in->bufpos = uVar6;
    uVar9 = in->charbuf[uVar6];
    if (uVar6 == 0) {
      in->pushed = no;
    }
    if (uVar9 == 10) {
      in->curcol = 1;
      in->curline = in->curline + 1;
      uVar1 = in->curlastpos;
      uVar11 = uVar1 + 1 & 0x3f;
      in->curlastpos = uVar11;
      uVar5 = in->firstlastpos;
      uVar9 = 10;
    }
    else {
      in->curcol = in->curcol + 1;
      uVar2 = in->curlastpos;
      uVar11 = uVar2 + 1 & 0x3f;
      in->curlastpos = uVar11;
      uVar5 = in->firstlastpos;
    }
    if (uVar11 == uVar5) {
      in->firstlastpos = uVar5 + 1 & 0x3f;
    }
  }
  return uVar9;
}

Assistant:

uint TY_(ReadChar)( StreamIn *in )
{
    uint c = EndOfStream;

    if ( in->pushed )
        return PopChar( in );

    SaveLastPos( in );

    if ( in->tabs > 0 )
    {
        in->curcol++;
        in->tabs--;
        return ' ';
    }
    
    for (;;)
    {
        c = ReadCharFromStream(in);

        if ( EndOfStream == c )
            return EndOfStream;

        if (c == '\n')
        {
            in->curcol = 1;
            in->curline++;
            break;
        }

        if (c == '\t')
        {
            Bool keeptabs = cfg( in->doc, TidyKeepTabs );
            if (!keeptabs) {
                uint tabsize = cfg(in->doc, TidyTabSize);
                in->tabs = tabsize > 0 ?
                    tabsize - ((in->curcol - 1) % tabsize) - 1
                    : 0;
                c = ' ';
            }
            in->curcol++;
            break;
        }

        /* #427663 - map '\r' to '\n' - Andy Quick 11 Aug 00 */
        if (c == '\r')
        {
            c = ReadCharFromStream(in);
            if (c != '\n')
            {
                TY_(UngetChar)( c, in );
                c = '\n';
            }
            else
            {
            }
            in->curcol = 1;
            in->curline++;
            break;
        }

#ifndef NO_NATIVE_ISO2022_SUPPORT
        /* strip control characters, except for Esc */
        if (c == '\033')
            break;
#endif

        /* Form Feed is allowed in HTML */
        if ( c == '\015' && !cfgBool(in->doc, TidyXmlTags) )
            break;
            
        if ( c < 32 )
            continue; /* discard control char */

        /* watch out for chars that have already been decoded such as */
        /* IS02022, UTF-8 etc, that don't require further decoding */

        if (
            in->encoding == RAW
#ifndef NO_NATIVE_ISO2022_SUPPORT
         || in->encoding == ISO2022
#endif
         || in->encoding == UTF8
         || in->encoding == SHIFTJIS /* #431953 - RJ */
         || in->encoding == BIG5     /* #431953 - RJ */
           )
        {
            in->curcol++;
            break;
        }

        /* handle surrogate pairs */
        if ( in->encoding == UTF16LE ||
             in->encoding == UTF16   ||
             in->encoding == UTF16BE )
        {
            if ( !TY_(IsValidUTF16FromUCS4)(c) )
            {
                /* invalid UTF-16 value */
                TY_(ReportEncodingError)(in->doc, INVALID_UTF16, c, yes);
                c = 0;
            }
            else if ( TY_(IsLowSurrogate)(c) )
            {
                uint n = c;
                uint m = ReadCharFromStream( in );
                if ( m == EndOfStream )
                   return EndOfStream;

                c = 0;
                if ( TY_(IsHighSurrogate)(m) )
                {
                    n = TY_(CombineSurrogatePair)( m, n );
                    if ( TY_(IsValidCombinedChar)(n) )
                        c = n;
                }
                /* not a valid pair */
                if ( 0 == c )
                    TY_(ReportEncodingError)( in->doc, INVALID_UTF16, c, yes );
            }
        }

        /* Do first: acts on range 128 - 255 */
        switch ( in->encoding )
        {
        case MACROMAN:
            c = TY_(DecodeMacRoman)( c );
            break;
        case IBM858:
            c = DecodeIbm850( c );
            break;
        case LATIN0:
            c = DecodeLatin0( c );
            break;
        }

        /* produced e.g. as a side-effect of smart quotes in Word */
        /* but can't happen if using MACROMAN encoding */
        if ( 127 < c && c < 160 )
        {
            uint c1 = 0, replMode = DISCARDED_CHAR;
            Bool isVendorChar = ( in->encoding == WIN1252 ||
                                  in->encoding == MACROMAN );
            Bool isMacChar    = ( in->encoding == MACROMAN );
            
            /* set error position just before offending character */
            if (in->doc->lexer)
            {
                in->doc->lexer->lines = in->curline;
                in->doc->lexer->columns = in->curcol;
            }
                
            if ( isMacChar )
                c1 = TY_(DecodeMacRoman)( c );
            else
                c1 = TY_(DecodeWin1252)( c );
            if ( c1 )
                replMode = REPLACED_CHAR;
                
            if ( c1 == 0 && isVendorChar )
                TY_(ReportEncodingError)(in->doc, VENDOR_SPECIFIC_CHARS, c, replMode == DISCARDED_CHAR);
            else if ( ! isVendorChar )
                TY_(ReportEncodingError)(in->doc, INVALID_SGML_CHARS, c, replMode == DISCARDED_CHAR);
                
            c = c1;
        }

        if ( c == 0 )
            continue; /* illegal char is discarded */
        
        in->curcol++;
        break;
    }

    return c;
}